

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_mbox.hpp
# Opt level: O1

iterator * __thiscall
so_5::impl::local_mbox_details::subscriber_adaptive_container_t::find_in_vector
          (iterator *__return_storage_ptr__,subscriber_adaptive_container_t *this,agent_t *agent)

{
  subscriber_info_t *psVar1;
  __normal_iterator<so_5::impl::local_mbox_details::subscriber_info_t_*,_std::vector<so_5::impl::local_mbox_details::subscriber_info_t,_std::allocator<so_5::impl::local_mbox_details::subscriber_info_t>_>_>
  _Var2;
  subscriber_info_t info;
  
  _Var2 = std::
          __lower_bound<__gnu_cxx::__normal_iterator<so_5::impl::local_mbox_details::subscriber_info_t*,std::vector<so_5::impl::local_mbox_details::subscriber_info_t,std::allocator<so_5::impl::local_mbox_details::subscriber_info_t>>>,so_5::impl::local_mbox_details::subscriber_info_t,__gnu_cxx::__ops::_Iter_less_val>
                    ((this->m_vector).
                     super__Vector_base<so_5::impl::local_mbox_details::subscriber_info_t,_std::allocator<so_5::impl::local_mbox_details::subscriber_info_t>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (this->m_vector).
                     super__Vector_base<so_5::impl::local_mbox_details::subscriber_info_t,_std::allocator<so_5::impl::local_mbox_details::subscriber_info_t>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
  psVar1 = (this->m_vector).
           super__Vector_base<so_5::impl::local_mbox_details::subscriber_info_t,_std::allocator<so_5::impl::local_mbox_details::subscriber_info_t>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((_Var2._M_current == psVar1) || ((_Var2._M_current)->m_agent != agent)) {
    _Var2._M_current = psVar1;
  }
  __return_storage_ptr__->m_storage = vector;
  (__return_storage_ptr__->m_it_v)._M_current = _Var2._M_current;
  (__return_storage_ptr__->m_it_m)._M_node = (_Base_ptr)0x0;
  return __return_storage_ptr__;
}

Assistant:

iterator
	find_in_vector( agent_t * agent )
		{
			subscriber_info_t info{ agent };
			auto pos = std::lower_bound( m_vector.begin(), m_vector.end(), info );
			if( pos != m_vector.end() && pos->subscriber_pointer() == agent )
				return iterator{ pos };
			else
				return iterator{ m_vector.end() };
		}